

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::operator+=(path *this,string_type *x)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  path p;
  path local_38;
  
  pcVar2 = (x->_M_dataplus)._M_p;
  paVar1 = &local_38._path.field_2;
  local_38._path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_38,pcVar2,pcVar2 + x->_M_string_length);
  postprocess_path_with_format(&local_38,(format)pcVar2);
  _Var3._M_p = local_38._path._M_dataplus._M_p;
  std::__cxx11::string::_M_append((char *)this,(ulong)local_38._path._M_dataplus._M_p);
  postprocess_path_with_format(this,(format)_Var3._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._path._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._path._M_dataplus._M_p,local_38._path.field_2._M_allocated_capacity + 1
                   );
  }
  return this;
}

Assistant:

GHC_INLINE path& path::operator+=(const string_type& x)
{
    return concat(x);
}